

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

void __thiscall
Kernel::InferenceStore::outputUnsatCore(InferenceStore *this,ostream *out,Unit *refutation)

{
  Inference *pIVar1;
  pointer pcVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  size_t i;
  long lVar6;
  Unit *pUVar7;
  Formula *pFVar8;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  bool dummy;
  UnitIterator parents;
  Set<Kernel::Unit_*,_Lib::DefaultHash> visited;
  bool local_99;
  Unit *local_98;
  long local_90;
  undefined1 local_88 [24];
  SplitSet *pSStack_70;
  SplitSet *local_68;
  SplitSet *pSStack_60;
  Set<Kernel::Unit_*,_Lib::DefaultHash> local_58;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
  cVar3 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  local_68 = (SplitSet *)0x0;
  pSStack_60 = (SplitSet *)0x0;
  local_88._16_8_ = 0;
  pSStack_70 = (SplitSet *)0x0;
  ::Lib::Stack<Kernel::Unit_*>::expand((Stack<Kernel::Unit_*> *)(local_88 + 0x10));
  *(Unit **)local_68 = refutation;
  local_68 = (SplitSet *)((long)local_68 + 8);
  local_58._capacity = 0;
  local_58._nonemptyCells = 0;
  local_58._size = 0;
  local_58._entries = (Cell *)0x0;
  ::Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::expand(&local_58);
  if (local_68 != pSStack_70) {
    do {
      pUVar7 = *(Unit **)local_68[-1]._items;
      uVar11 = 0;
      if (pUVar7 != (Unit *)0x0) {
        uVar11 = pUVar7->_number;
      }
      local_98 = (Unit *)CONCAT44(local_98._4_4_,uVar11);
      uVar11 = 0x811c9dc5;
      lVar6 = 0;
      do {
        uVar11 = (*(byte *)((long)&local_98 + lVar6) ^ uVar11) * 0x1000193;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_98 = pUVar7;
      local_68 = (SplitSet *)local_68[-1]._items;
      ::Lib::Set<Kernel::Unit*,Lib::DefaultHash>::
      rawFindOrInsert<Lib::Set<Kernel::Unit*,Lib::DefaultHash>::insert(Kernel::Unit*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Unit*,Lib::DefaultHash>::insert(Kernel::Unit*,unsigned_int)::_lambda(auto:1)_1_>
                ((Set<Kernel::Unit*,Lib::DefaultHash> *)&local_58,(anon_class_8_1_ba1d8281)&local_98
                 ,uVar11,(anon_class_8_1_ba1d8281)&local_98,&local_99);
      if ((pUVar7->_inference).field_0x1 == '\0') {
        if ((pUVar7->field_0x4 & 1) != 0) {
          pFVar8 = Unit::getFormula(pUVar7);
          bVar5 = Formula::hasLabel(pFVar8);
          if (bVar5) {
            pFVar8 = Unit::getFormula(pUVar7);
            local_98 = (Unit *)local_88;
            pcVar2 = (pFVar8->_label)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar2,pcVar2 + (pFVar8->_label)._M_string_length);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,(char *)local_98,local_90);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
LAB_0053bb08:
            if (local_98 != (Unit *)local_88) {
              operator_delete(local_98,local_88._0_8_ + 1);
            }
          }
          else if (*(char *)(::Lib::env + 0xd35a) == '\0') {
            pFVar8 = Unit::getFormula(pUVar7);
            bVar5 = Formula::hasLabel(pFVar8);
            if (!bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ERROR: There is a problem with the unsat core. There is an input formula in the proof"
                         ,0x55);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "that does not have a label. We expect all  input formulas to have labels as this  is what"
                         ,0x59);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "smtcomp does. If you don\'t want this then use the ignore_missing_inputs_in_unsat_core option"
                         ,0x5c);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"The unlabelled  input formula is ",0x21);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
              Unit::toString_abi_cxx11_((string *)&local_98,pUVar7);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_98,local_90);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              goto LAB_0053bb08;
            }
          }
        }
      }
      else {
        Unit::getParents((Unit *)&local_98);
        while (cVar4 = (**(code **)(*(long *)local_98 + 0x10))(), cVar4 != '\0') {
          pUVar7 = (Unit *)(**(code **)(*(long *)local_98 + 0x18))();
          bVar5 = ::Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::contains(&local_58,pUVar7);
          if (!bVar5) {
            if (local_68 == pSStack_60) {
              ::Lib::Stack<Kernel::Unit_*>::expand((Stack<Kernel::Unit_*> *)(local_88 + 0x10));
            }
            local_68->_size = (size_t)pUVar7;
            local_68 = (SplitSet *)local_68->_items;
          }
        }
        if (local_98 != (Unit *)0x0) {
          pIVar1 = &local_98->_inference;
          *(int *)pIVar1 = *(int *)pIVar1 + -1;
          if (*(int *)pIVar1 == 0) {
            (**(code **)(*(long *)local_98 + 8))();
          }
        }
      }
    } while (local_68 != pSStack_70);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (local_58._entries != (Cell *)0x0) {
    if ((long)local_58._capacity == 0) {
      *(undefined8 *)local_58._entries = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._entries;
    }
    else {
      uVar10 = (long)local_58._capacity * 0x10;
      if (uVar10 < 0x11) {
        *(undefined8 *)local_58._entries = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._entries;
      }
      else if (uVar10 < 0x19) {
        *(undefined8 *)local_58._entries = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._entries;
      }
      else if (uVar10 < 0x21) {
        *(undefined8 *)local_58._entries = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._entries;
      }
      else if (uVar10 < 0x31) {
        *(undefined8 *)local_58._entries = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._entries;
      }
      else if (uVar10 < 0x41) {
        *(undefined8 *)local_58._entries = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._entries;
      }
      else {
        operator_delete(local_58._entries,0x10);
      }
    }
  }
  if (pSStack_70 != (SplitSet *)0x0) {
    uVar10 = local_88._16_8_ * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      pSStack_70->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pSStack_70;
    }
    else if (uVar10 < 0x11) {
      pSStack_70->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pSStack_70;
    }
    else if (uVar10 < 0x19) {
      pSStack_70->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pSStack_70;
    }
    else if (uVar10 < 0x21) {
      pSStack_70->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pSStack_70;
    }
    else if (uVar10 < 0x31) {
      pSStack_70->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pSStack_70;
    }
    else if (uVar10 < 0x41) {
      pSStack_70->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pSStack_70;
    }
    else {
      operator_delete(pSStack_70,0x10);
    }
  }
  return;
}

Assistant:

void InferenceStore::outputUnsatCore(std::ostream& out, Unit* refutation)
{
  out << "(" << endl;

  Stack<Unit*> todo;
  todo.push(refutation);
  Set<Unit*> visited;
  while(!todo.isEmpty()){

    Unit* u = todo.pop();
    visited.insert(u);

    if(u->inference().rule() ==  InferenceRule::INPUT){
      if(!u->isClause()){
        if(u->getFormula()->hasLabel()){
          std::string label =  u->getFormula()->getLabel();
          out << label << endl;
        }
        else{
          ASS(env.options->ignoreMissingInputsInUnsatCore() || u->getFormula()->hasLabel());
          if(!(env.options->ignoreMissingInputsInUnsatCore() || u->getFormula()->hasLabel())){
            cout << "ERROR: There is a problem with the unsat core. There is an input formula in the proof" <<  endl;
            cout << "that does not have a label. We expect all  input formulas to have labels as this  is what" << endl;
            cout << "smtcomp does. If you don't want this then use the ignore_missing_inputs_in_unsat_core option" << endl;
            cout << "The unlabelled  input formula is " << endl;
            cout << u->toString() << endl;
          }
        }
      }
      else{
        //Currently ignore clauses as they cannot come from SMT-LIB as input formulas
      }
    }
    else{
      UnitIterator parents = u->getParents();
      while(parents.hasNext()){
        Unit* parent = parents.next();
        if(!visited.contains(parent)){
          todo.push(parent);
        }
      }
    }
  }

  out << ")" << endl;
}